

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptorProto::MergeFrom
          (FileDescriptorProto *this,FileDescriptorProto *from)

{
  int *piVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  DescriptorProto *from_00;
  EnumDescriptorProto *from_01;
  ServiceDescriptorProto *from_02;
  FieldDescriptorProto *from_03;
  LogMessage *other;
  DescriptorProto *this_00;
  EnumDescriptorProto *this_01;
  ServiceDescriptorProto *this_02;
  FieldDescriptorProto *this_03;
  string *psVar7;
  FileOptions *pFVar8;
  SourceCodeInfo *pSVar9;
  long lVar10;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x605);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->dependency_).super_RepeatedPtrFieldBase,
             (from->dependency_).super_RepeatedPtrFieldBase.current_size_ +
             (this->dependency_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->dependency_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      iVar4 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        psVar7 = (string *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->dependency_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->dependency_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        psVar7 = internal::StringTypeHandlerBase::New_abi_cxx11_();
        ppvVar6 = (this->dependency_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->dependency_).super_RepeatedPtrFieldBase.current_size_;
        (this->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)psVar7);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->dependency_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar4 = (from->public_dependency_).current_size_;
  if (iVar4 != 0) {
    RepeatedField<int>::Reserve
              (&this->public_dependency_,iVar4 + (this->public_dependency_).current_size_);
    memcpy((this->public_dependency_).elements_ + (this->public_dependency_).current_size_,
           (from->public_dependency_).elements_,(long)(from->public_dependency_).current_size_ << 2)
    ;
    piVar1 = &(this->public_dependency_).current_size_;
    *piVar1 = *piVar1 + (from->public_dependency_).current_size_;
  }
  iVar4 = (from->weak_dependency_).current_size_;
  if (iVar4 != 0) {
    RepeatedField<int>::Reserve
              (&this->weak_dependency_,iVar4 + (this->weak_dependency_).current_size_);
    memcpy((this->weak_dependency_).elements_ + (this->weak_dependency_).current_size_,
           (from->weak_dependency_).elements_,(long)(from->weak_dependency_).current_size_ << 2);
    piVar1 = &(this->weak_dependency_).current_size_;
    *piVar1 = *piVar1 + (from->weak_dependency_).current_size_;
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->message_type_).super_RepeatedPtrFieldBase,
             (from->message_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->message_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->message_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_00 = (DescriptorProto *)
                (from->message_type_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar4 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
        (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_00 = (DescriptorProto *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->message_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->message_type_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar6 = (this->message_type_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->message_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = this_00;
      }
      DescriptorProto::MergeFrom(this_00,from_00);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->message_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->enum_type_).super_RepeatedPtrFieldBase,
             (from->enum_type_).super_RepeatedPtrFieldBase.current_size_ +
             (this->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_01 = (EnumDescriptorProto *)
                (from->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_01 = (EnumDescriptorProto *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
        ppvVar6 = (this->enum_type_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (this->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = this_01;
      }
      EnumDescriptorProto::MergeFrom(this_01,from_01);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->enum_type_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->service_).super_RepeatedPtrFieldBase,
             (from->service_).super_RepeatedPtrFieldBase.current_size_ +
             (this->service_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->service_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_02 = (ServiceDescriptorProto *)
                (from->service_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar4 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->service_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->service_).super_RepeatedPtrFieldBase.elements_;
        (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_02 = (ServiceDescriptorProto *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->service_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->service_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->service_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_02 = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
        ppvVar6 = (this->service_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->service_).super_RepeatedPtrFieldBase.current_size_;
        (this->service_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = this_02;
      }
      ServiceDescriptorProto::MergeFrom(this_02,from_02);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->service_).super_RepeatedPtrFieldBase.current_size_);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->extension_).super_RepeatedPtrFieldBase,
             (from->extension_).super_RepeatedPtrFieldBase.current_size_ +
             (this->extension_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->extension_).super_RepeatedPtrFieldBase.current_size_) {
    lVar10 = 0;
    do {
      from_03 = (FieldDescriptorProto *)
                (from->extension_).super_RepeatedPtrFieldBase.elements_[lVar10];
      iVar4 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar5 = (this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar4 < iVar5) {
        ppvVar6 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        this_03 = (FieldDescriptorProto *)ppvVar6[iVar4];
      }
      else {
        iVar4 = (this->extension_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar5 == iVar4) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->extension_).super_RepeatedPtrFieldBase,iVar4 + 1);
        }
        piVar1 = &(this->extension_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        this_03 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar6 = (this->extension_).super_RepeatedPtrFieldBase.elements_;
        iVar4 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
        (this->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar4 + 1;
        ppvVar6[iVar4] = this_03;
      }
      FieldDescriptorProto::MergeFrom(this_03,from_03);
      lVar10 = lVar10 + 1;
    } while (lVar10 < (from->extension_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar3 = (byte)from->_has_bits_[0];
  if (bVar3 != 0) {
    if ((bVar3 & 1) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 1;
      if (this->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->name_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)this->name_);
    }
    if ((from->_has_bits_[0] & 2) != 0) {
      this->_has_bits_[0] = this->_has_bits_[0] | 2;
      if (this->package_ == (string *)internal::kEmptyString_abi_cxx11_) {
        psVar7 = (string *)operator_new(0x20);
        (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
        psVar7->_M_string_length = 0;
        (psVar7->field_2)._M_local_buf[0] = '\0';
        this->package_ = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)this->package_);
    }
  }
  if ((from->_has_bits_[0] & 0x1fe00) != 0) {
    if ((from->_has_bits_[0] >> 9 & 1) != 0) {
      pbVar2 = (byte *)((long)this->_has_bits_ + 1);
      *pbVar2 = *pbVar2 | 2;
      if (this->options_ == (FileOptions *)0x0) {
        pFVar8 = (FileOptions *)operator_new(0x88);
        FileOptions::FileOptions(pFVar8);
        this->options_ = pFVar8;
      }
      pFVar8 = from->options_;
      if (pFVar8 == (FileOptions *)0x0) {
        pFVar8 = *(FileOptions **)(default_instance_ + 0xb8);
      }
      FileOptions::MergeFrom(this->options_,pFVar8);
    }
    if ((from->_has_bits_[0] & 0x400) != 0) {
      pbVar2 = (byte *)((long)this->_has_bits_ + 1);
      *pbVar2 = *pbVar2 | 4;
      if (this->source_code_info_ == (SourceCodeInfo *)0x0) {
        pSVar9 = (SourceCodeInfo *)operator_new(0x30);
        SourceCodeInfo::SourceCodeInfo(pSVar9);
        this->source_code_info_ = pSVar9;
      }
      pSVar9 = from->source_code_info_;
      if (pSVar9 == (SourceCodeInfo *)0x0) {
        pSVar9 = *(SourceCodeInfo **)(default_instance_ + 0xc0);
      }
      SourceCodeInfo::MergeFrom(this->source_code_info_,pSVar9);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FileDescriptorProto::MergeFrom(const FileDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  dependency_.MergeFrom(from.dependency_);
  public_dependency_.MergeFrom(from.public_dependency_);
  weak_dependency_.MergeFrom(from.weak_dependency_);
  message_type_.MergeFrom(from.message_type_);
  enum_type_.MergeFrom(from.enum_type_);
  service_.MergeFrom(from.service_);
  extension_.MergeFrom(from.extension_);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_package()) {
      set_package(from.package());
    }
  }
  if (from._has_bits_[9 / 32] & (0xffu << (9 % 32))) {
    if (from.has_options()) {
      mutable_options()->::google::protobuf::FileOptions::MergeFrom(from.options());
    }
    if (from.has_source_code_info()) {
      mutable_source_code_info()->::google::protobuf::SourceCodeInfo::MergeFrom(from.source_code_info());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}